

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

idx_t duckdb::DBConfig::ParseMemoryLimit(string *arg)

{
  bool bVar1;
  pointer pcVar2;
  ulong uVar3;
  ParserException *pPVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  idx_t iVar8;
  double dVar9;
  allocator local_d9;
  string unit;
  string local_b8;
  double local_98;
  anon_union_16_2_67f50693_for_value local_80;
  string number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((*(arg->_M_dataplus)._M_p == '-') || (bVar1 = ::std::operator==(arg,"null"), bVar1)) ||
     (bVar1 = ::std::operator==(arg,"none"), bVar1)) {
    return 0xffffffffffffffff;
  }
  pcVar2 = (arg->_M_dataplus)._M_p;
  lVar7 = 0;
  while ((uVar3 = (ulong)(byte)pcVar2[lVar7], uVar3 < 0x21 &&
         ((0x100003e00U >> (uVar3 & 0x3f) & 1) != 0))) {
    lVar7 = lVar7 + 1;
  }
  lVar6 = 0;
  do {
    pcVar2 = pcVar2 + 1;
    bVar5 = (byte)uVar3;
    if ((char)bVar5 < '0') {
      if (1 < (byte)(bVar5 - 0x2d)) {
LAB_01468132:
        if (lVar6 == 0) {
          pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&number,"Memory limit must have a number (e.g. SET memory_limit=1GB",
                     (allocator *)&unit);
          ParserException::ParserException(pPVar4,&number);
          __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::substr((ulong)&number,(ulong)arg);
        string_t::string_t((string_t *)&local_80.pointer,&number);
        local_98 = Cast::Operation<duckdb::string_t,double>((string_t)local_80);
        lVar7 = lVar7 - lVar6;
        pcVar2 = (arg->_M_dataplus)._M_p;
        while ((uVar3 = (ulong)(byte)pcVar2[lVar7], uVar3 < 0x21 &&
               ((0x100003e00U >> (uVar3 & 0x3f) & 1) != 0))) {
          lVar7 = lVar7 + 1;
        }
        lVar6 = 0;
        while (((ulong)(lVar7 + lVar6) < arg->_M_string_length &&
               ((uVar3 = (ulong)(byte)pcVar2[lVar7 + lVar6], 0x20 < uVar3 ||
                ((0x100003e00U >> (uVar3 & 0x3f) & 1) == 0))))) {
          lVar6 = lVar6 + 1;
        }
        if (0.0 <= local_98) {
          ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)arg);
          StringUtil::Lower(&unit,&local_b8);
          ::std::__cxx11::string::~string((string *)&local_b8);
          bVar1 = ::std::operator==(&unit,"byte");
          dVar9 = 1.0;
          if (!bVar1) {
            bVar1 = ::std::operator==(&unit,"bytes");
            if (bVar1) {
              dVar9 = 1.0;
            }
            else {
              bVar1 = ::std::operator==(&unit,"b");
              dVar9 = 1.0;
              if (!bVar1) {
                bVar1 = ::std::operator==(&unit,"kilobyte");
                dVar9 = 1000.0;
                if (!bVar1) {
                  bVar1 = ::std::operator==(&unit,"kilobytes");
                  if ((bVar1) || (bVar1 = ::std::operator==(&unit,"kb"), bVar1)) {
                    dVar9 = 1000.0;
                  }
                  else {
                    bVar1 = ::std::operator==(&unit,"k");
                    dVar9 = 1000.0;
                    if (!bVar1) {
                      bVar1 = ::std::operator==(&unit,"megabyte");
                      dVar9 = 1000000.0;
                      if (!bVar1) {
                        bVar1 = ::std::operator==(&unit,"megabytes");
                        if ((bVar1) || (bVar1 = ::std::operator==(&unit,"mb"), bVar1)) {
                          dVar9 = 1000000.0;
                        }
                        else {
                          bVar1 = ::std::operator==(&unit,"m");
                          dVar9 = 1000000.0;
                          if (!bVar1) {
                            bVar1 = ::std::operator==(&unit,"gigabyte");
                            if (((bVar1) || (bVar1 = ::std::operator==(&unit,"gigabytes"), bVar1))
                               || (bVar1 = ::std::operator==(&unit,"gb"), bVar1)) {
                              dVar9 = 1000000000.0;
                            }
                            else {
                              bVar1 = ::std::operator==(&unit,"g");
                              dVar9 = 1000000000.0;
                              if (!bVar1) {
                                bVar1 = ::std::operator==(&unit,"terabyte");
                                if (((bVar1) ||
                                    (bVar1 = ::std::operator==(&unit,"terabytes"), bVar1)) ||
                                   (bVar1 = ::std::operator==(&unit,"tb"), bVar1)) {
                                  dVar9 = 1000000000000.0;
                                }
                                else {
                                  bVar1 = ::std::operator==(&unit,"t");
                                  dVar9 = 1000000000000.0;
                                  if (!bVar1) {
                                    bVar1 = ::std::operator==(&unit,"kib");
                                    if (bVar1) {
                                      dVar9 = 1024.0;
                                    }
                                    else {
                                      bVar1 = ::std::operator==(&unit,"mib");
                                      if (bVar1) {
                                        dVar9 = 1048576.0;
                                      }
                                      else {
                                        bVar1 = ::std::operator==(&unit,"gib");
                                        if (bVar1) {
                                          dVar9 = 1073741824.0;
                                        }
                                        else {
                                          bVar1 = ::std::operator==(&unit,"tib");
                                          if (!bVar1) {
                                            pPVar4 = (ParserException *)
                                                     __cxa_allocate_exception(0x10);
                                            ::std::__cxx11::string::string
                                                      ((string *)&local_b8,
                                                                                                              
                                                  "Unknown unit for memory_limit: \'%s\' (expected: KB, MB, GB, TB for 1000^i units or KiB, MiB, GiB, TiB for 1024^i units)"
                                                  ,&local_d9);
                                            ::std::__cxx11::string::string
                                                      ((string *)&local_50,(string *)&unit);
                                            ParserException::ParserException<std::__cxx11::string>
                                                      (pPVar4,&local_b8,&local_50);
                                            __cxa_throw(pPVar4,&ParserException::typeinfo,
                                                        ::std::runtime_error::~runtime_error);
                                          }
                                          dVar9 = 1099511627776.0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar3 = (ulong)(local_98 * dVar9);
          iVar8 = (long)(local_98 * dVar9 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
          ::std::__cxx11::string::~string((string *)&unit);
        }
        else {
          iVar8 = 0xffffffffffffffff;
        }
        ::std::__cxx11::string::~string((string *)&number);
        return iVar8;
      }
    }
    else if ((0x39 < bVar5) && (((uint)uVar3 | 0x20) != 0x65)) goto LAB_01468132;
    uVar3 = (ulong)(byte)pcVar2[lVar7];
    lVar6 = lVar6 + -1;
  } while( true );
}

Assistant:

vector<std::string> DBConfig::GetOptionNames() {
	vector<string> names;
	for (idx_t i = 0, option_count = DBConfig::GetOptionCount(); i < option_count; i++) {
		names.emplace_back(DBConfig::GetOptionByIndex(i)->name);
	}
	return names;
}